

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H19_binary_search.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int iVar2;
  int notfound;
  int found;
  int arr [10];
  int n;
  
  arr[9] = 0;
  arr[8] = 10;
  memcpy(&notfound,&DAT_00102010,0x28);
  iVar1 = func(&notfound,0,10,0x7b);
  iVar2 = func(&notfound,0,10,4);
  if (iVar1 != 8) {
    __assert_fail("found == 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H19_binary_search.c"
                  ,0x1f,"int main()");
  }
  if (iVar2 == -1) {
    return 0;
  }
  __assert_fail("notfound == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H19_binary_search.c"
                ,0x20,"int main()");
}

Assistant:

int main() {
  const int n = 10;
  int arr[n] = {10, 34, 40, 52, 66, 89, 91, 103, 123};

  int found = func(arr, 0, n, 123);
  int notfound = func(arr, 0, n, 4);

  assert(found == 8);
  assert(notfound == -1);

  return 0;
}